

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAllTargetsLoadMS::Run(BasicAllTargetsLoadMS *this)

{
  CallLogWrapper *pCVar1;
  BasicAllTargetsLoadMS *pBVar2;
  bool bVar3;
  bool bVar4;
  GLuint GVar5;
  GLint GVar6;
  ostream *poVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  int iVar8;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  GLenum e_04;
  GLuint index;
  uint uVar9;
  int in_ESI;
  char *pcVar10;
  GLenum GVar11;
  vec4 *pvVar12;
  byte bVar13;
  long lVar14;
  Vector<float,_4> local_418;
  undefined4 local_404;
  CallLogWrapper *local_400;
  BasicAllTargetsLoadMS *local_3f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_3f0;
  string local_3c8;
  GLchar name [32];
  GLint uniforms;
  GLuint textures [2];
  string local_348;
  GLuint fbo;
  GLenum draw_buffers [3];
  GLfloat local_2e8 [2];
  DataType aDStack_2e0 [4];
  char *local_2d0 [4];
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  GLint isamples;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  
  bVar3 = ShaderImageLoadStoreBase::SupportedSamples(&this->super_ShaderImageLoadStoreBase,in_ESI);
  if (bVar3) {
    local_3f8 = this;
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    local_2e8[0] = -1.0;
    local_2e8[1] = 10.0;
    aDStack_2e0[0] = 0xc3480000;
    aDStack_2e0[1] = 0x453b8000;
    local_418.m_data[0] = -1.0;
    local_418.m_data[1] = 10.0;
    local_418.m_data[2] = -200.0;
    local_418.m_data[3] = 3000.0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
    poVar7 = std::operator<<((ostream *)&name_index_map,
                             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_3f0.first,(void *)0x8814,e);
    poVar7 = std::operator<<(poVar7,(string *)&local_3f0);
    pcVar10 = ") readonly uniform ";
    poVar7 = std::operator<<(poVar7,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              ((string *)name,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)name);
    poVar7 = std::operator<<(poVar7,"image2DMS g_image_2dms;\nlayout(");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_3c8,(void *)0x8814,e_00);
    poVar7 = std::operator<<(poVar7,(string *)&local_3c8);
    pcVar10 = ") readonly uniform ";
    poVar7 = std::operator<<(poVar7,") readonly uniform ");
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              ((string *)draw_buffers,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)draw_buffers);
    pcVar10 = 
    "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              ((string *)textures,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)textures);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != ";
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              ((string *)&fbo,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&fbo);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != ";
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              ((string *)&uniforms,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&uniforms);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != ";
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_348,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_348);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_1d0,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_1d0);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_1f0,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_1f0);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_210,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_210);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_230,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_230);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_250,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_250);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_270,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_270);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_290,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_290);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    pcVar10 = 
    ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
    ;
    poVar7 = std::operator<<(poVar7,
                             ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
                            );
    gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
              (&local_2b0,pcVar10);
    poVar7 = std::operator<<(poVar7,(string *)&local_2b0);
    poVar7 = std::operator<<(poVar7,"vec4");
    poVar7 = tcu::operator<<(poVar7,&local_418);
    std::operator<<(poVar7,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}");
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&uniforms);
    std::__cxx11::string::~string((string *)&fbo);
    std::__cxx11::string::~string((string *)textures);
    std::__cxx11::string::~string((string *)draw_buffers);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)name);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
    pBVar2 = local_3f8;
    GVar5 = ShaderImageLoadStoreBase::BuildProgram
                      (&local_3f8->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,local_2d0[0],(bool *)0x0);
    std::__cxx11::string::~string((string *)local_2d0);
    pCVar1 = &(pBVar2->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper;
    glu::CallLogWrapper::glGenTextures(pCVar1,2,textures);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,textures[0]);
    glu::CallLogWrapper::glTexImage2DMultisample(pCVar1,0x9100,4,0x8814,0x10,0x10,'\0');
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,textures[1]);
    glu::CallLogWrapper::glTexImage3DMultisample(pCVar1,0x9102,4,0x8814,0x10,0x10,2,'\0');
    glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,0);
    glu::CallLogWrapper::glGenFramebuffers(pCVar1,1,&fbo);
    glu::CallLogWrapper::glBindFramebuffer(pCVar1,0x8d40,fbo);
    glu::CallLogWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0x9100,textures[0],0);
    glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce1,textures[1],0,0);
    glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce2,textures[1],0,1);
    draw_buffers[0] = 0x8ce0;
    draw_buffers[1] = 0x8ce1;
    draw_buffers[2] = 0x8ce2;
    glu::CallLogWrapper::glDrawBuffers(pCVar1,3,draw_buffers);
    glu::CallLogWrapper::glClearBufferfv(pCVar1,0x1800,0,local_2e8);
    glu::CallLogWrapper::glClearBufferfv(pCVar1,0x1800,1,local_2e8);
    glu::CallLogWrapper::glClearBufferfv(pCVar1,0x1800,2,local_2e8);
    glu::CallLogWrapper::glDeleteFramebuffers(pCVar1,1,&fbo);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,35000,0x8814);
    pvVar12 = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[1],0,'\x01',0,35000,0x8814);
    glu::CallLogWrapper::glUseProgram(pCVar1,GVar5);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar5,"g_image_2dms");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,1);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar5,"g_image_2dms_array");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,4);
    glu::CallLogWrapper::glClear(pCVar1,0x4000);
    pBVar2 = local_3f8;
    glu::CallLogWrapper::glBindVertexArray(pCVar1,local_3f8->m_vao);
    iVar8 = 0x10;
    glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
    glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
    name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
    bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&pBVar2->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,iVar8,
                       pvVar12);
    local_404 = (undefined4)CONCAT71(extraout_var,bVar3);
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_400 = pCVar1;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar5,0x8b86,&uniforms);
    if (uniforms != 2) {
      local_404 = 0;
      anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
    }
    for (uVar9 = 0; GVar11 = (GLenum)pvVar12, uVar9 < (uint)uniforms; uVar9 = uVar9 + 1) {
      pvVar12 = (vec4 *)name;
      glu::CallLogWrapper::glGetActiveUniformName(local_400,GVar5,uVar9,0x20,(GLsizei *)0x0,name);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,(char *)name,(allocator<char> *)&local_348);
      local_3f0.first._M_string_length = local_3c8._M_string_length;
      local_3f0.first._M_dataplus._M_p = (pointer)&local_3f0.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p == &local_3c8.field_2) {
        local_3f0.first.field_2._8_8_ = local_3c8.field_2._8_8_;
      }
      else {
        local_3f0.first._M_dataplus._M_p = local_3c8._M_dataplus._M_p;
      }
      local_3f0.first.field_2._M_allocated_capacity._1_7_ =
           local_3c8.field_2._M_allocated_capacity._1_7_;
      local_3f0.first.field_2._M_local_buf[0] = local_3c8.field_2._M_local_buf[0];
      local_3c8._M_string_length = 0;
      local_3c8.field_2._M_local_buf[0] = '\0';
      local_3f0.second = uVar9;
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::__cxx11::string::~string((string *)&local_3c8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"g_image_2dms",(allocator<char> *)name);
    bVar3 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_3f8->super_ShaderImageLoadStoreBase,GVar5,&local_3f0.first,
                       &name_index_map,0x9055,GVar11);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"g_image_2dms_array",(allocator<char> *)name);
    bVar4 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_3f8->super_ShaderImageLoadStoreBase,GVar5,&local_3f0.first,
                       &name_index_map,0x9056,GVar11);
    std::__cxx11::string::~string((string *)&local_3f0);
    glu::CallLogWrapper::glDeleteTextures(local_400,2,textures);
    glu::CallLogWrapper::glUseProgram(local_400,0);
    glu::CallLogWrapper::glDeleteProgram(local_400,GVar5);
    bVar13 = (byte)local_404;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&name_index_map._M_t);
    if ((bVar13 & bVar3 & bVar4) == 1) {
      glu::CallLogWrapper::glGetIntegerv(local_400,0x9110,&isamples);
      if (3 < isamples) {
        local_2e8[0] = 1.4013e-45;
        local_2e8[1] = -NAN;
        aDStack_2e0[0] = TYPE_FLOAT_VEC3;
        aDStack_2e0[1] = ~TYPE_FLOAT_VEC3;
        local_418.m_data[0] = 1.4013e-45;
        local_418.m_data[1] = -NAN;
        local_418.m_data[2] = 4.2039e-45;
        local_418.m_data[3] = -NAN;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
        poVar7 = std::operator<<((ostream *)&name_index_map,
                                 "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout("
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_3f0.first,(void *)0x8d82,e_01);
        poVar7 = std::operator<<(poVar7,(string *)&local_3f0);
        pcVar10 = ") readonly uniform ";
        poVar7 = std::operator<<(poVar7,") readonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  ((string *)name,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)name);
        poVar7 = std::operator<<(poVar7,"image2DMS g_image_2dms;\nlayout(");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_3c8,(void *)0x8d82,e_02);
        poVar7 = std::operator<<(poVar7,(string *)&local_3c8);
        pcVar10 = ") readonly uniform ";
        poVar7 = std::operator<<(poVar7,") readonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  ((string *)draw_buffers,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)draw_buffers);
        pcVar10 = 
        "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  ((string *)textures,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)textures);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  ((string *)&fbo,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&fbo);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  ((string *)&uniforms,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&uniforms);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_348,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_348);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_1d0,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_1d0);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_1f0,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_1f0);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_210,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_210);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_230,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_230);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_250,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_250);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_270,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_270);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_290,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_290);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<int,4>>
                  (&local_2b0,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_2b0);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<int,_4> *)&local_418);
        std::operator<<(poVar7,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}");
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&uniforms);
        std::__cxx11::string::~string((string *)&fbo);
        std::__cxx11::string::~string((string *)textures);
        std::__cxx11::string::~string((string *)draw_buffers);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)name);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
        GVar5 = ShaderImageLoadStoreBase::BuildProgram
                          (&local_3f8->super_ShaderImageLoadStoreBase,
                           "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                           ,(char *)0x0,(char *)0x0,(char *)0x0,local_2d0[0],(bool *)0x0);
        std::__cxx11::string::~string((string *)local_2d0);
        pCVar1 = local_400;
        glu::CallLogWrapper::glGenTextures(local_400,2,textures);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,textures[0]);
        glu::CallLogWrapper::glTexImage2DMultisample(pCVar1,0x9100,4,0x8d82,0x10,0x10,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,0);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,textures[1]);
        glu::CallLogWrapper::glTexImage3DMultisample(pCVar1,0x9102,4,0x8d82,0x10,0x10,2,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,0);
        glu::CallLogWrapper::glGenFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindFramebuffer(pCVar1,0x8d40,fbo);
        glu::CallLogWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0x9100,textures[0],0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce1,textures[1],0,0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce2,textures[1],0,1);
        draw_buffers[0] = 0x8ce0;
        draw_buffers[1] = 0x8ce1;
        draw_buffers[2] = 0x8ce2;
        glu::CallLogWrapper::glDrawBuffers(pCVar1,3,draw_buffers);
        glu::CallLogWrapper::glClearBufferiv(pCVar1,0x1800,0,(GLint *)local_2e8);
        glu::CallLogWrapper::glClearBufferiv(pCVar1,0x1800,1,(GLint *)local_2e8);
        glu::CallLogWrapper::glClearBufferiv(pCVar1,0x1800,2,(GLint *)local_2e8);
        glu::CallLogWrapper::glDeleteFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,35000,0x8d82);
        pvVar12 = (vec4 *)0x0;
        glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[1],0,'\x01',0,35000,0x8d82);
        glu::CallLogWrapper::glUseProgram(pCVar1,GVar5);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar5,"g_image_2dms");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,1);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar5,"g_image_2dms_array");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,4);
        glu::CallLogWrapper::glClear(pCVar1,0x4000);
        pBVar2 = local_3f8;
        glu::CallLogWrapper::glBindVertexArray(pCVar1,local_3f8->m_vao);
        iVar8 = 0x10;
        glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
        name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
        bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                          (&pBVar2->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                           iVar8,pvVar12);
        local_404 = (undefined4)CONCAT71(extraout_var_00,bVar3);
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar5,0x8b86,&uniforms);
        if (uniforms != 2) {
          local_404 = 0;
          anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
        }
        for (uVar9 = 0; GVar11 = (GLenum)pvVar12, uVar9 < (uint)uniforms; uVar9 = uVar9 + 1) {
          pvVar12 = (vec4 *)name;
          glu::CallLogWrapper::glGetActiveUniformName
                    (local_400,GVar5,uVar9,0x20,(GLsizei *)0x0,name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,(char *)name,(allocator<char> *)&local_348);
          local_3f0.first._M_string_length = local_3c8._M_string_length;
          local_3f0.first._M_dataplus._M_p = (pointer)&local_3f0.first.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p == &local_3c8.field_2) {
            local_3f0.first.field_2._8_8_ = local_3c8.field_2._8_8_;
          }
          else {
            local_3f0.first._M_dataplus._M_p = local_3c8._M_dataplus._M_p;
          }
          local_3f0.first.field_2._M_allocated_capacity._1_7_ =
               local_3c8.field_2._M_allocated_capacity._1_7_;
          local_3f0.first.field_2._M_local_buf[0] = local_3c8.field_2._M_local_buf[0];
          local_3c8._M_string_length = 0;
          local_3c8.field_2._M_local_buf[0] = '\0';
          local_3f0.second = uVar9;
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                      *)&name_index_map,&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_3c8);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"g_image_2dms",(allocator<char> *)name);
        bVar3 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3f8->super_ShaderImageLoadStoreBase,GVar5,&local_3f0.first,
                           &name_index_map,0x9060,GVar11);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"g_image_2dms_array",(allocator<char> *)name);
        bVar4 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3f8->super_ShaderImageLoadStoreBase,GVar5,&local_3f0.first,
                           &name_index_map,0x9061,GVar11);
        std::__cxx11::string::~string((string *)&local_3f0);
        glu::CallLogWrapper::glDeleteTextures(local_400,2,textures);
        glu::CallLogWrapper::glUseProgram(local_400,0);
        glu::CallLogWrapper::glDeleteProgram(local_400,GVar5);
        bVar13 = (byte)local_404;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~_Rb_tree(&name_index_map._M_t);
        if ((bVar13 & bVar3 & bVar4) != 1) {
          return -1;
        }
        local_2e8[0] = 1.4013e-45;
        local_2e8[1] = 2.8026e-45;
        aDStack_2e0[0] = TYPE_FLOAT_VEC3;
        aDStack_2e0[1] = TYPE_FLOAT_VEC4;
        local_418.m_data[0] = 1.4013e-45;
        local_418.m_data[1] = 2.8026e-45;
        local_418.m_data[2] = 4.2039e-45;
        local_418.m_data[3] = 5.60519e-45;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
        poVar7 = std::operator<<((ostream *)&name_index_map,
                                 "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout("
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_3f0.first,(void *)0x8d70,e_03);
        poVar7 = std::operator<<(poVar7,(string *)&local_3f0);
        pcVar10 = ") readonly uniform ";
        poVar7 = std::operator<<(poVar7,") readonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>((string *)name,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)name);
        poVar7 = std::operator<<(poVar7,"image2DMS g_image_2dms;\nlayout(");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                  (&local_3c8,(void *)0x8d70,e_04);
        poVar7 = std::operator<<(poVar7,(string *)&local_3c8);
        pcVar10 = ") readonly uniform ";
        poVar7 = std::operator<<(poVar7,") readonly uniform ");
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>((string *)draw_buffers,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)draw_buffers);
        pcVar10 = 
        "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageLoad(g_image_2dms, coord, 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>((string *)textures,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)textures);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&fbo,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&fbo);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>((string *)&uniforms,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&uniforms);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != ";
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms, coord, 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_348,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_348);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_1d0,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_1d0);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_1f0,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_1f0);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_210,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_210);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 0), 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_230,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_230);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 0) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_250,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_250);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 1) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_270,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_270);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 2) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_290,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_290);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        pcVar10 = 
        ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
        ;
        poVar7 = std::operator<<(poVar7,
                                 ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  if (imageLoad(g_image_2dms_array, ivec3(coord, 1), 3) != "
                                );
        gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::
        TypePrefix<tcu::Vector<unsigned_int,4>>(&local_2b0,pcVar10);
        poVar7 = std::operator<<(poVar7,(string *)&local_2b0);
        poVar7 = std::operator<<(poVar7,"vec4");
        poVar7 = tcu::operator<<(poVar7,(Vector<unsigned_int,_4> *)&local_418);
        std::operator<<(poVar7,") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n}");
        std::__cxx11::string::~string((string *)&local_2b0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&uniforms);
        std::__cxx11::string::~string((string *)&fbo);
        std::__cxx11::string::~string((string *)textures);
        std::__cxx11::string::~string((string *)draw_buffers);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)name);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
        GVar5 = ShaderImageLoadStoreBase::BuildProgram
                          (&local_3f8->super_ShaderImageLoadStoreBase,
                           "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                           ,(char *)0x0,(char *)0x0,(char *)0x0,local_2d0[0],(bool *)0x0);
        std::__cxx11::string::~string((string *)local_2d0);
        pCVar1 = local_400;
        glu::CallLogWrapper::glGenTextures(local_400,2,textures);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,textures[0]);
        glu::CallLogWrapper::glTexImage2DMultisample(pCVar1,0x9100,4,0x8d70,0x10,0x10,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9100,0);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,textures[1]);
        glu::CallLogWrapper::glTexImage3DMultisample(pCVar1,0x9102,4,0x8d70,0x10,0x10,2,'\0');
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9102,0);
        glu::CallLogWrapper::glGenFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindFramebuffer(pCVar1,0x8d40,fbo);
        glu::CallLogWrapper::glFramebufferTexture2D(pCVar1,0x8d40,0x8ce0,0x9100,textures[0],0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce1,textures[1],0,0);
        glu::CallLogWrapper::glFramebufferTextureLayer(pCVar1,0x8d40,0x8ce2,textures[1],0,1);
        draw_buffers[0] = 0x8ce0;
        draw_buffers[1] = 0x8ce1;
        draw_buffers[2] = 0x8ce2;
        glu::CallLogWrapper::glDrawBuffers(pCVar1,3,draw_buffers);
        glu::CallLogWrapper::glClearBufferuiv(pCVar1,0x1800,0,(GLuint *)local_2e8);
        glu::CallLogWrapper::glClearBufferuiv(pCVar1,0x1800,1,(GLuint *)local_2e8);
        glu::CallLogWrapper::glClearBufferuiv(pCVar1,0x1800,2,(GLuint *)local_2e8);
        glu::CallLogWrapper::glDeleteFramebuffers(pCVar1,1,&fbo);
        glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[0],0,'\0',0,35000,0x8d70);
        pvVar12 = (vec4 *)0x0;
        glu::CallLogWrapper::glBindImageTexture(pCVar1,4,textures[1],0,'\x01',0,35000,0x8d70);
        glu::CallLogWrapper::glUseProgram(pCVar1,GVar5);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar5,"g_image_2dms");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,1);
        GVar6 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar5,"g_image_2dms_array");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar6,4);
        glu::CallLogWrapper::glClear(pCVar1,0x4000);
        pBVar2 = local_3f8;
        glu::CallLogWrapper::glBindVertexArray(pCVar1,local_3f8->m_vao);
        iVar8 = 0x10;
        glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
        name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
        bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                          (&pBVar2->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                           iVar8,pvVar12);
        local_404 = (undefined4)CONCAT71(extraout_var_01,bVar3);
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &name_index_map._M_t._M_impl.super__Rb_tree_header._M_header;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar5,0x8b86,&uniforms);
        if (uniforms != 2) {
          local_404 = 0;
          anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
        }
        for (uVar9 = 0; GVar11 = (GLenum)pvVar12, uVar9 < (uint)uniforms; uVar9 = uVar9 + 1) {
          pvVar12 = (vec4 *)name;
          glu::CallLogWrapper::glGetActiveUniformName
                    (local_400,GVar5,uVar9,0x20,(GLsizei *)0x0,name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,(char *)name,(allocator<char> *)&local_348);
          local_3f0.first._M_string_length = local_3c8._M_string_length;
          local_3f0.first._M_dataplus._M_p = (pointer)&local_3f0.first.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p == &local_3c8.field_2) {
            local_3f0.first.field_2._8_8_ = local_3c8.field_2._8_8_;
          }
          else {
            local_3f0.first._M_dataplus._M_p = local_3c8._M_dataplus._M_p;
          }
          local_3f0.first.field_2._M_allocated_capacity._1_7_ =
               local_3c8.field_2._M_allocated_capacity._1_7_;
          local_3f0.first.field_2._M_local_buf[0] = local_3c8.field_2._M_local_buf[0];
          local_3c8._M_string_length = 0;
          local_3c8.field_2._M_local_buf[0] = '\0';
          local_3f0.second = uVar9;
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                      *)&name_index_map,&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_3c8);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"g_image_2dms",(allocator<char> *)name);
        bVar3 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3f8->super_ShaderImageLoadStoreBase,GVar5,&local_3f0.first,
                           &name_index_map,0x906b,GVar11);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"g_image_2dms_array",(allocator<char> *)name);
        bVar4 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_3f8->super_ShaderImageLoadStoreBase,GVar5,&local_3f0.first,
                           &name_index_map,0x906c,GVar11);
        std::__cxx11::string::~string((string *)&local_3f0);
        glu::CallLogWrapper::glDeleteTextures(local_400,2,textures);
        glu::CallLogWrapper::glUseProgram(local_400,0);
        glu::CallLogWrapper::glDeleteProgram(local_400,GVar5);
        bVar13 = (byte)local_404;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~_Rb_tree(&name_index_map._M_t);
        if ((bVar13 & bVar3 & bVar4) != 1) {
          return -1;
        }
      }
      lVar14 = 0;
    }
    else {
      lVar14 = -1;
    }
  }
  else {
    lVar14 = 0x10;
  }
  return lVar14;
}

Assistant:

virtual long Run()
	{
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!ReadMS(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;

		GLint isamples;
		glGetIntegerv(GL_MAX_INTEGER_SAMPLES, &isamples);
		if (isamples >= 4)
		{
			if (!ReadMS(GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
				return ERROR;
			if (!ReadMS(GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
				return ERROR;
		}

		return NO_ERROR;
	}